

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_Guid UA_Guid_random(void)

{
  UA_Guid UVar1;
  undefined1 uVar2;
  undefined2 uVar3;
  undefined1 uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  undefined2 local_1c;
  undefined2 uStack_1a;
  UA_UInt32 r;
  UA_Guid result;
  
  uVar5 = pcg32_random_r(&UA_rng);
  uVar6 = pcg32_random_r(&UA_rng);
  local_1c = (undefined2)uVar6;
  uVar3 = local_1c;
  uStack_1a = (undefined2)(uVar6 >> 0x10);
  uVar6 = pcg32_random_r(&UA_rng);
  local_1c._0_1_ = (undefined1)uVar6;
  uVar2 = (undefined1)local_1c;
  local_1c._1_1_ = (undefined1)(uVar6 >> 8);
  uVar4 = local_1c._1_1_;
  uVar7 = pcg32_random_r(&UA_rng);
  local_1c._0_1_ = (undefined1)uVar7;
  local_1c._1_1_ = (undefined1)(uVar7 >> 8);
  UVar1.data2 = uVar3;
  UVar1.data1 = uVar5;
  UVar1.data3 = uStack_1a;
  UVar1.data4[0] = uVar2;
  UVar1.data4[1] = (char)(uVar6 >> 4);
  UVar1.data4[2] = uVar4;
  UVar1.data4[3] = (char)(uVar6 >> 0xc);
  UVar1.data4[4] = (undefined1)local_1c;
  UVar1.data4[5] = (char)(uVar7 >> 4);
  UVar1.data4[6] = local_1c._1_1_;
  UVar1.data4[7] = (UA_Byte)(uVar7 >> 0xc);
  return UVar1;
}

Assistant:

UA_Guid
UA_Guid_random(void) {
    UA_Guid result;
    result.data1 = (UA_UInt32)pcg32_random_r(&UA_rng);
    UA_UInt32 r = (UA_UInt32)pcg32_random_r(&UA_rng);
    result.data2 = (UA_UInt16) r;
    result.data3 = (UA_UInt16) (r >> 16);
    r = (UA_UInt32)pcg32_random_r(&UA_rng);
    result.data4[0] = (UA_Byte)r;
    result.data4[1] = (UA_Byte)(r >> 4);
    result.data4[2] = (UA_Byte)(r >> 8);
    result.data4[3] = (UA_Byte)(r >> 12);
    r = (UA_UInt32)pcg32_random_r(&UA_rng);
    result.data4[4] = (UA_Byte)r;
    result.data4[5] = (UA_Byte)(r >> 4);
    result.data4[6] = (UA_Byte)(r >> 8);
    result.data4[7] = (UA_Byte)(r >> 12);
    return result;
}